

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_file_system.cpp
# Opt level: O1

unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> __thiscall
duckdb::GZipFileSystem::OpenCompressedFile
          (GZipFileSystem *this,
          unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *handle,
          bool write)

{
  pointer pcVar1;
  pointer pFVar2;
  GZipFile *this_00;
  bool in_CL;
  undefined7 in_register_00000011;
  unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *this_01;
  string path;
  _Head_base<0UL,_duckdb::FileHandle_*,_false> local_50;
  string local_48;
  
  this_01 = (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true> *)
            CONCAT71(in_register_00000011,write);
  pFVar2 = unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>::operator->
                     (this_01);
  pcVar1 = (pFVar2->path)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (pFVar2->path)._M_string_length);
  this_00 = (GZipFile *)operator_new(0xb8);
  local_50._M_head_impl =
       (this_01->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>).
       _M_t.super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t
       .super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
       super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl;
  (this_01->super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>.
  super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl = (FileHandle *)0x0;
  GZipFile::GZipFile(this_00,(unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>,_true>
                              *)&local_50,&local_48,in_CL);
  if (local_50._M_head_impl != (FileHandle *)0x0) {
    (*(local_50._M_head_impl)->_vptr_FileHandle[1])();
  }
  (this->super_CompressedFileSystem).super_FileSystem._vptr_FileSystem = (_func_int **)this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)
         (unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>)this;
}

Assistant:

unique_ptr<FileHandle> GZipFileSystem::OpenCompressedFile(unique_ptr<FileHandle> handle, bool write) {
	auto path = handle->path;
	return make_uniq<GZipFile>(std::move(handle), path, write);
}